

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushID(char *str_id)

{
  ImGuiWindow *this;
  ImGuiID local_c;
  
  this = GImGui->CurrentWindow;
  local_c = ImGuiWindow::GetID(this,str_id,(char *)0x0);
  ImVector<unsigned_int>::push_back(&this->IDStack,&local_c);
  return;
}

Assistant:

void ImGui::PushID(const char* str_id)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    window->IDStack.push_back(window->GetID(str_id));
}